

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O2

int coda_cursor_read_char_partial_array
              (coda_cursor_conflict *cursor,long offset,long length,char *dst)

{
  coda_backend cVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  char *message;
  coda_type *type;
  long in_FS_OFFSET;
  long num_elements;
  coda_native_type read_type;
  
  if (((cursor == (coda_cursor_conflict *)0x0) || (cursor->n < 1)) ||
     (type = (coda_type *)cursor->stack[cursor->n - 1].type, type == (coda_type *)0x0)) {
    pcVar3 = "invalid cursor argument (%s:%u)";
    uVar4 = 0x15a6;
  }
  else {
    if (dst != (char *)0x0) {
      if (99 < type->format) {
        type = *(coda_type **)&type->type_class;
      }
      if (type->type_class == coda_array_class) {
        if (*(int *)(in_FS_OFFSET + -0x1208) != 0) {
          iVar2 = coda_cursor_get_num_elements(cursor,&num_elements);
          if (iVar2 != 0) {
            return -1;
          }
          if (offset < 0 || num_elements <= offset) {
            coda_set_error(-0x6b,"array offset (%ld) exceeds array range [0:%ld)",offset,
                           num_elements);
            return -1;
          }
          if (num_elements < length + offset) {
            coda_set_error(-0x6b,"array offset (%ld) + length (%ld) exceeds array range [0:%ld)",
                           offset,length);
            return -1;
          }
        }
        get_array_element_read_type(type,&read_type);
        if (read_type == coda_native_type_char) {
          cVar1 = (cursor->stack[(long)cursor->n + -1].type)->backend;
          switch(cVar1) {
          case coda_backend_memory:
            iVar2 = coda_mem_cursor_read_char_partial_array(cursor,offset,length,dst);
            break;
          case coda_backend_hdf4:
            coda_set_error(-0xb,(char *)0x0);
            return -1;
          case coda_backend_hdf5:
switchD_0010cc51_caseD_66:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                          ,0x6d4,
                          "int read_char_partial_array(const coda_cursor *, long, long, char *)");
          case coda_backend_cdf:
            iVar2 = coda_cdf_cursor_read_char_partial_array(cursor,offset,length,dst);
            break;
          case coda_backend_netcdf:
            iVar2 = coda_netcdf_cursor_read_char_partial_array(cursor,offset,length,dst);
            break;
          default:
            if (cVar1 == coda_backend_binary) {
              iVar2 = coda_bin_cursor_read_char_partial_array(cursor,offset,length,dst);
            }
            else {
              if (cVar1 != coda_backend_ascii) goto switchD_0010cc51_caseD_66;
              iVar2 = coda_ascii_cursor_read_char_partial_array(cursor,offset,length,dst);
            }
          }
          return -(uint)(iVar2 != 0);
        }
        pcVar3 = coda_type_get_native_type_name(read_type);
        message = "can not read %s data using a char data type";
      }
      else {
        pcVar3 = coda_type_get_class_name(type->type_class);
        message = "cursor does not refer to an array (current type is %s)";
      }
      coda_set_error(-0x69,message,pcVar3);
      return -1;
    }
    pcVar3 = "dst argument is NULL (%s:%u)";
    uVar4 = 0x15ab;
  }
  coda_set_error(-100,pcVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                 ,uVar4);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_read_char_partial_array(const coda_cursor *cursor, long offset, long length, char *dst)
{
    coda_native_type read_type;
    coda_type *type;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    /* check the range for offset and length */
    if (coda_option_perform_boundary_checks)
    {
        long num_elements;

        if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
        {
            return -1;
        }
        if (offset < 0 || offset >= num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array offset (%ld) exceeds array range [0:%ld)", offset,
                           num_elements);
            return -1;
        }
        if (offset + length > num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array offset (%ld) + length (%ld) exceeds array range "
                           "[0:%ld)", offset, length, num_elements);
            return -1;
        }
    }

    if (get_array_element_read_type(type, &read_type) != 0)
    {
        return -1;
    }
    switch (read_type)
    {
        case coda_native_type_char:
            if (read_char_partial_array(cursor, offset, length, dst) != 0)
            {
                return -1;
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a char data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}